

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O0

int Nwk_ManVerifyTiming(Nwk_Man_t *pNtk)

{
  uint uVar1;
  int iVar2;
  Nwk_Obj_t *p;
  float fVar3;
  float f1;
  float fVar4;
  int local_24;
  int i;
  float tRequired;
  float tArrival;
  Nwk_Obj_t *pObj;
  Nwk_Man_t *pNtk_local;
  
  for (local_24 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar2; local_24 = local_24 + 1) {
    p = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,local_24);
    if ((p != (Nwk_Obj_t *)0x0) &&
       ((iVar2 = Nwk_ObjIsCi(p), iVar2 == 0 || (iVar2 = Nwk_ObjFanoutNum(p), iVar2 != 0)))) {
      fVar3 = Nwk_NodeComputeArrival(p,1);
      f1 = Nwk_NodeComputeRequired(p,1);
      fVar4 = Nwk_ObjArrival(p);
      iVar2 = Nwk_ManTimeEqual(fVar3,fVar4,0.01);
      if (iVar2 == 0) {
        uVar1 = p->Id;
        fVar4 = Nwk_ObjArrival(p);
        printf("Nwk_ManVerifyTiming(): Object %d has different arrival time (%.2f) from computed (%.2f).\n"
               ,(double)fVar4,(double)fVar3,(ulong)uVar1);
      }
      fVar3 = Nwk_ObjRequired(p);
      iVar2 = Nwk_ManTimeEqual(f1,fVar3,0.01);
      if (iVar2 == 0) {
        uVar1 = p->Id;
        fVar3 = Nwk_ObjRequired(p);
        printf("Nwk_ManVerifyTiming(): Object %d has different required time (%.2f) from computed (%.2f).\n"
               ,(double)fVar3,(double)f1,(ulong)uVar1);
      }
    }
  }
  return 1;
}

Assistant:

int Nwk_ManVerifyTiming(  Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    float tArrival, tRequired;
    int i;
    Nwk_ManForEachObj( pNtk, pObj, i )
    {
        if ( Nwk_ObjIsCi(pObj) && Nwk_ObjFanoutNum(pObj) == 0 )
            continue;
        tArrival = Nwk_NodeComputeArrival( pObj, 1 );
        tRequired = Nwk_NodeComputeRequired( pObj, 1 );
        if ( !Nwk_ManTimeEqual( tArrival, Nwk_ObjArrival(pObj), (float)0.01 ) )
            printf( "Nwk_ManVerifyTiming(): Object %d has different arrival time (%.2f) from computed (%.2f).\n", 
                pObj->Id, Nwk_ObjArrival(pObj), tArrival );
        if ( !Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pObj), (float)0.01 ) )
            printf( "Nwk_ManVerifyTiming(): Object %d has different required time (%.2f) from computed (%.2f).\n", 
                pObj->Id, Nwk_ObjRequired(pObj), tRequired );
    }
    return 1;
}